

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O3

void __thiscall fasttext::ProductQuantizer::train(ProductQuantizer *this,int32_t n,real *x)

{
  uint uVar1;
  int iVar2;
  invalid_argument *this_00;
  long *plVar3;
  long *plVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  int n_00;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  vector<int,_std::allocator<int>_> perm;
  vector<float,_std::allocator<float>_> xslice;
  int local_d0;
  vector<int,_std::allocator<int>_> local_c0;
  long lStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  minstd_rand *local_80;
  ulong local_78;
  real *local_70;
  ulong local_68;
  size_t local_60;
  long local_58;
  string local_50;
  
  if (this->ksub_ <= n) {
    local_a0._M_dataplus._M_p._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_c0,(long)n,(value_type_conflict1 *)&local_a0,(allocator_type *)&local_50);
    if (local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      auVar10 = vpmovsxbd_avx512f(_DAT_0012b700);
      auVar11 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar12 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar13 = vpbroadcastd_avx512f(ZEXT416(0x10));
      uVar5 = 0;
      auVar14 = vpbroadcastq_avx512f();
      auVar14 = vpsrlq_avx512f(auVar14,2);
      do {
        auVar15 = vpbroadcastq_avx512f();
        auVar16 = vporq_avx512f(auVar15,auVar11);
        auVar15 = vporq_avx512f(auVar15,auVar12);
        vpcmpuq_avx512f(auVar15,auVar14,2);
        vpcmpuq_avx512f(auVar16,auVar14,2);
        auVar15 = vmovdqu32_avx512f(auVar10);
        *(undefined1 (*) [64])
         (local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start + uVar5) = auVar15;
        uVar5 = uVar5 + 0x10;
        auVar10 = vpaddd_avx512f(auVar10,auVar13);
      } while ((((ulong)((long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish +
                        (-4 - (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start)) >> 2) + 0x10 &
               0xfffffffffffffff0) != uVar5);
    }
    uVar1 = this->max_points_;
    local_d0 = this->dsub_;
    uVar5 = (ulong)(uint)n;
    if ((int)uVar1 < n) {
      uVar5 = (ulong)uVar1;
    }
    n_00 = (int)uVar5;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&local_a0,(long)(n_00 * local_d0),
               (allocator_type *)&local_50);
    iVar2 = this->nsubq_;
    if (0 < iVar2) {
      local_80 = &this->rng;
      uVar6 = 0;
      local_78 = uVar5;
      local_70 = x;
      do {
        iVar7 = (int)uVar6;
        if (iVar7 == iVar2 + -1) {
          local_d0 = this->lastdsub_;
        }
        if ((int)uVar1 < n) {
          std::
          shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>&>
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,local_80);
        }
        uVar5 = local_78;
        local_68 = uVar6;
        if (0 < n_00) {
          local_58 = (long)local_d0;
          lVar9 = 0;
          uVar6 = 0;
          local_60 = local_58 * 4;
          do {
            memcpy((void *)(lVar9 * 4 +
                           CONCAT44(local_a0._M_dataplus._M_p._4_4_,local_a0._M_dataplus._M_p._0_4_)
                           ),
                   x + (long)this->dim_ *
                       (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar6] +
                       (long)this->dsub_ * (long)iVar7,local_60);
            lVar9 = lVar9 + local_58;
            uVar6 = uVar6 + 1;
          } while (uVar5 != uVar6);
        }
        kmeans(this,(real *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,local_a0._M_dataplus._M_p._0_4_
                                    ),
               (this->centroids_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start +
               (long)this->dsub_ * (long)this->ksub_ * (long)iVar7,n_00,local_d0);
        iVar2 = this->nsubq_;
        uVar8 = (int)local_68 + 1;
        uVar6 = (ulong)uVar8;
      } while ((int)uVar8 < iVar2);
    }
    if ((void *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,local_a0._M_dataplus._M_p._0_4_) !=
        (void *)0x0) {
      operator_delete((void *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,
                                       local_a0._M_dataplus._M_p._0_4_));
    }
    if (local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_50,this->ksub_);
  std::operator+(&local_a0,"Matrix too small for quantization, must have at least ",&local_50);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_a0);
  plVar4 = plVar3 + 2;
  local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)*plVar3;
  if ((long *)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start == plVar4) {
    local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar4;
    lStack_a8 = plVar3[3];
    local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
  }
  else {
    local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar4;
  }
  local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::invalid_argument::invalid_argument(this_00,(string *)&local_c0);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void ProductQuantizer::train(int32_t n, const real* x) {
  if (n < ksub_) {
    throw std::invalid_argument(
        "Matrix too small for quantization, must have at least " +
        std::to_string(ksub_) + " rows");
  }
  std::vector<int32_t> perm(n, 0);
  std::iota(perm.begin(), perm.end(), 0);
  auto d = dsub_;
  auto np = std::min(n, max_points_);
  auto xslice = std::vector<real>(np * dsub_);
  for (auto m = 0; m < nsubq_; m++) {
    if (m == nsubq_ - 1) {
      d = lastdsub_;
    }
    if (np != n) {
      std::shuffle(perm.begin(), perm.end(), rng);
    }
    for (auto j = 0; j < np; j++) {
      memcpy(
          xslice.data() + j * d,
          x + perm[j] * dim_ + m * dsub_,
          d * sizeof(real));
    }
    kmeans(xslice.data(), get_centroids(m, 0), np, d);
  }
}